

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall PowerPos<0,_0,_0>::propagate_z(PowerPos<0,_0,_0> *this)

{
  Reason r;
  bool bVar1;
  Lit LVar2;
  Lit LVar3;
  int64_t iVar4;
  IntView<0> *in_RDI;
  IntView<0> *this_00;
  IntView<0> *this_01;
  double dVar5;
  Reason m_r_1;
  int64_t m_v_1;
  double z_max_new;
  Reason m_r;
  int64_t m_v;
  double z_min_new;
  IntView<0> *in_stack_ffffffffffffff88;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Reason local_28;
  long local_20;
  double local_18;
  
  iVar4 = IntView<0>::getMin(in_RDI);
  this_00 = (IntView<0> *)(double)iVar4;
  iVar4 = IntView<0>::getMin(in_RDI);
  local_18 = pow((double)this_00,(double)iVar4);
  if (-500000000.0 < local_18) {
    local_20 = (long)local_18;
    bVar1 = IntView<0>::setMinNotR(in_RDI,(int64_t)in_stack_ffffffffffffff88);
    if (bVar1) {
      Reason::Reason(&local_28,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        IntView<0>::getMinLit(in_stack_ffffffffffffff88);
        IntView<0>::getMinLit(in_stack_ffffffffffffff88);
        Reason::Reason((Reason *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (Lit)in_stack_ffffffffffffffb4,(Lit)in_stack_ffffffffffffffb0);
      }
      bVar1 = IntView<0>::setMin(this_00,(int64_t)in_RDI,(Reason)in_stack_ffffffffffffffa0,
                                 SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
  }
  iVar4 = IntView<0>::getMax(in_RDI);
  this_01 = (IntView<0> *)(double)iVar4;
  iVar4 = IntView<0>::getMax(in_RDI);
  dVar5 = pow((double)this_01,(double)iVar4);
  if ((dVar5 < 500000000.0) && (bVar1 = IntView<0>::setMaxNotR(in_RDI,(int64_t)this_01), bVar1)) {
    Reason::Reason((Reason *)&stack0xffffffffffffffb0,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      LVar2 = IntView<0>::getMaxLit(this_01);
      LVar3 = IntView<0>::getMaxLit(this_01);
      Reason::Reason((Reason *)CONCAT44(LVar2.x,LVar3.x),(Lit)in_stack_ffffffffffffffb4,
                     (Lit)in_stack_ffffffffffffffb0);
    }
    r.field_0._a._4_4_ = in_stack_ffffffffffffffb4;
    r.field_0._a._0_4_ = in_stack_ffffffffffffffb0;
    bVar1 = IntView<0>::setMax(this_00,(int64_t)in_RDI,r,SUB81((ulong)this_01 >> 0x38,0));
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate_z() {
		// Propagation on the lower bound
		const double z_min_new = pow(x.getMin(), y.getMin());
		if (z_min_new > (double)IntVar::min_limit) {
			setDom(z, setMin, static_cast<int64_t>(z_min_new), x.getMinLit(), y.getMinLit());
		}
		// Propagation on the upper bound
		const double z_max_new = pow(x.getMax(), y.getMax());
		if (z_max_new < (double)IntVar::max_limit) {
			setDom(z, setMax, static_cast<int64_t>(z_max_new), x.getMaxLit(), y.getMaxLit());
		}
		return true;
	}